

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

base_learner * recall_tree_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  option_group_definition *l_00;
  pointer prVar4;
  uint *puVar5;
  ostream *poVar6;
  base_learner *pbVar7;
  learner<recall_tree_ns::recall_tree,_example> *this;
  vw *in_RSI;
  long *in_RDI;
  __type_conflict _Var8;
  double dVar9;
  learner<recall_tree_ns::recall_tree,_example> *l;
  option_group_definition new_options;
  free_ptr<recall_tree_ns::recall_tree> tree;
  undefined4 in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff36c;
  vw *in_stack_fffffffffffff370;
  string *in_stack_fffffffffffff378;
  _func_void_recall_tree_ptr_learner<char,_example>_ptr_example_ptr *predict;
  typed_option<float> *in_stack_fffffffffffff380;
  parser *base;
  free_ptr<recall_tree_ns::recall_tree> *in_stack_fffffffffffff390;
  learner<recall_tree_ns::recall_tree,_example> *this_00;
  prediction_type_t pred_type;
  char *local_c50;
  typed_option<float> *in_stack_fffffffffffff3b8;
  option_group_definition *in_stack_fffffffffffff3c0;
  recall_tree *in_stack_fffffffffffff3d0;
  size_t local_bf0;
  size_t local_ba8;
  allocator local_a69;
  string local_a68 [32];
  uint local_a48;
  allocator local_a41;
  string local_a40 [32];
  undefined4 local_a20;
  allocator local_a19;
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [32];
  typed_option<bool> local_9a8 [2];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  typed_option<bool> local_818 [2];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  typed_option<unsigned_long> local_688 [2];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [359];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [32];
  typed_option<unsigned_long> local_368 [2];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_int> local_1d8 [2];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  vw *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<recall_tree_ns::recall_tree>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Recall Tree",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"recall_tree",&local_1f9);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a86c8);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff378,(uint *)in_stack_fffffffffffff370)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Use online tree for multiclass",&local_221);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff370,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff3c0,(typed_option<unsigned_int> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"max_candidates",&local_389);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a87ca);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff378,(unsigned_long *)in_stack_fffffffffffff370);
  VW::config::typed_option<unsigned_long>::keep(local_368,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"maximum number of labels per leaf in the tree",&local_3b1)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  l_00 = VW::config::option_group_definition::add<unsigned_long>
                   (in_stack_fffffffffffff3c0,
                    (typed_option<unsigned_long> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"bern_hyper",&local_519);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a88cc);
  VW::config::make_option<float>(in_stack_fffffffffffff378,(float *)in_stack_fffffffffffff370);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff380,(float)((ulong)in_stack_fffffffffffff378 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"recall tree depth penalty",&local_541);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff370,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"max_depth",&local_6a9);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a89d1);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff378,(unsigned_long *)in_stack_fffffffffffff370);
  VW::config::typed_option<unsigned_long>::keep(local_688,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d0,"maximum depth of the tree, default log_2 (#classes)",&local_6d1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff3c0,(typed_option<unsigned_long> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"node_only",&local_839);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a8ad3);
  VW::config::make_option<bool>(in_stack_fffffffffffff378,(bool *)in_stack_fffffffffffff370);
  VW::config::typed_option<bool>::keep(local_818,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_860,"only use node features, not full path features",&local_861);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff370,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff3c0,(typed_option<bool> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"randomized_routing",&local_9c9);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a8bd5);
  VW::config::make_option<bool>(in_stack_fffffffffffff378,(bool *)in_stack_fffffffffffff370);
  VW::config::typed_option<bool>::keep(local_9a8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"randomized routing",&local_9f1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff370,
             (string *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff370,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff3c0,(typed_option<bool> *)in_stack_fffffffffffff3b8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff370);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (*(code *)**(undefined8 **)local_10)(local_10,local_60);
  uVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a18,"recall_tree",&local_a19);
  bVar3 = (**(code **)(*(long *)uVar2 + 8))(uVar2,local_a18);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  pvVar1 = local_18;
  if (((bVar3 ^ 0xff) & 1) == 0) {
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a954f);
    uVar2 = local_10;
    prVar4->all = pvVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a40,"max_candidates",&local_a41);
    bVar3 = (**(code **)(*(long *)uVar2 + 8))(uVar2,local_a40);
    if ((bVar3 & 1) == 0) {
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a95ff);
      std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a9618);
      _Var8 = std::log<unsigned_int>(0);
      dVar9 = log(2.0);
      dVar9 = ceil(_Var8 / dVar9);
      local_a48 = (int)(long)dVar9 << 2;
      puVar5 = std::min<unsigned_int>(&prVar4->k,&local_a48);
      local_ba8 = (size_t)*puVar5;
    }
    else {
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a95d9);
      local_ba8 = prVar4->max_candidates;
    }
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a96aa);
    prVar4->max_candidates = local_ba8;
    std::__cxx11::string::~string(local_a40);
    std::allocator<char>::~allocator((allocator<char> *)&local_a41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a68,"max_depth",&local_a69);
    bVar3 = (**(code **)(*(long *)local_10 + 8))(local_10,local_a68);
    if ((bVar3 & 1) == 0) {
      std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a976a);
      _Var8 = std::log<unsigned_int>(0);
      dVar9 = log(2.0);
      dVar9 = ceil(_Var8 / dVar9);
      local_bf0 = (long)dVar9 & 0xffffffff;
    }
    else {
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a974f);
      local_bf0 = prVar4->max_depth;
    }
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a97d3);
    prVar4->max_depth = local_bf0;
    std::__cxx11::string::~string(local_a68);
    std::allocator<char>::~allocator((allocator<char> *)&local_a69);
    std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::get
              ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)
               in_stack_fffffffffffff370);
    recall_tree_ns::init_tree(in_stack_fffffffffffff3d0);
    if ((local_18->quiet & 1U) == 0) {
      poVar6 = std::operator<<(&(local_18->trace_message).super_ostream,"recall_tree:");
      poVar6 = std::operator<<(poVar6," node_only = ");
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a9875);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(prVar4->node_only & 1));
      poVar6 = std::operator<<(poVar6," bern_hyper = ");
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a98b5);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,prVar4->bern_hyper);
      poVar6 = std::operator<<(poVar6," max_depth = ");
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a98f0);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,prVar4->max_depth);
      poVar6 = std::operator<<(poVar6," routing = ");
      if ((local_18->training & 1U) == 0) {
        local_c50 = "n/a testonly";
      }
      else {
        prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                           ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a993b);
        local_c50 = "deterministic";
        if ((prVar4->randomized_routing & 1U) != 0) {
          local_c50 = "randomized";
        }
      }
      poVar6 = std::operator<<(poVar6,local_c50);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pbVar7 = setup_base((options_i *)in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    pred_type = (prediction_type_t)pbVar7;
    LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
    base = local_18->p;
    in_stack_fffffffffffff380 = (typed_option<float> *)&stack0xffffffffffffffd8;
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a9a78);
    predict = (_func_void_recall_tree_ptr_learner<char,_example>_ptr_example_ptr *)
              prVar4->max_routers;
    std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
              ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2a9a8b);
    this = LEARNER::
           init_multiclass_learner<recall_tree_ns::recall_tree,example,LEARNER::learner<char,example>>
                     (in_stack_fffffffffffff390,(learner<char,_example> *)base,
                      (_func_void_recall_tree_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff380,predict,(parser *)in_stack_fffffffffffff370,
                      CONCAT44(in_stack_fffffffffffff36c,4),pred_type);
    this_00 = this;
    LEARNER::learner<recall_tree_ns::recall_tree,_example>::set_save_load
              (this,recall_tree_ns::save_load_tree);
    LEARNER::learner<recall_tree_ns::recall_tree,_example>::set_finish
              (this_00,(_func_void_recall_tree_ptr *)base);
    in_stack_fffffffffffff370 = (vw *)LEARNER::make_base<recall_tree_ns::recall_tree,example>(this);
    local_8 = in_stack_fffffffffffff370;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_a20 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff370);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)in_stack_fffffffffffff380)
  ;
  return (base_learner *)(vw *)local_8;
}

Assistant:

base_learner* recall_tree_setup(options_i& options, vw& all)
{
  auto tree = scoped_calloc_or_throw<recall_tree>();
  option_group_definition new_options("Recall Tree");
  new_options.add(make_option("recall_tree", tree->k).keep().help("Use online tree for multiclass"))
      .add(make_option("max_candidates", tree->max_candidates)
               .keep()
               .help("maximum number of labels per leaf in the tree"))
      .add(make_option("bern_hyper", tree->bern_hyper).default_value(1.f).help("recall tree depth penalty"))
      .add(make_option("max_depth", tree->max_depth).keep().help("maximum depth of the tree, default log_2 (#classes)"))
      .add(make_option("node_only", tree->node_only).keep().help("only use node features, not full path features"))
      .add(make_option("randomized_routing", tree->randomized_routing).keep().help("randomized routing"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("recall_tree"))
    return nullptr;

  tree->all = &all;
  tree->max_candidates = options.was_supplied("max_candidates")
      ? tree->max_candidates
      : (std::min)(tree->k, 4 * (uint32_t)(ceil(log(tree->k) / log(2.0))));
  tree->max_depth =
      options.was_supplied("max_depth") ? tree->max_depth : (uint32_t)std::ceil(std::log(tree->k) / std::log(2.0));

  init_tree(*tree.get());

  if (!all.quiet)
    all.trace_message << "recall_tree:"
                      << " node_only = " << tree->node_only << " bern_hyper = " << tree->bern_hyper
                      << " max_depth = " << tree->max_depth << " routing = "
                      << (all.training ? (tree->randomized_routing ? "randomized" : "deterministic") : "n/a testonly")
                      << std::endl;

  learner<recall_tree, example>& l = init_multiclass_learner(
      tree, as_singleline(setup_base(options, all)), learn, predict, all.p, tree->max_routers + tree->k);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}